

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t zip_read_data_deflate(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  size_t *psVar1;
  ushort uVar2;
  zip *zip;
  uchar *puVar3;
  size_t data_len;
  int error_number;
  wchar_t wVar4;
  uint uVar5;
  uchar *puVar6;
  uint8_t *in;
  uint8_t *out;
  char *fmt;
  uchar *puVar7;
  ssize_t bytes_avail;
  size_t dsize;
  
  zip = (zip *)a->format->data;
  if (zip->uncompressed_buffer == (uchar *)0x0) {
    zip->uncompressed_buffer_size = 0x40000;
    puVar6 = (uchar *)malloc(0x40000);
    zip->uncompressed_buffer = puVar6;
    if (puVar6 != (uchar *)0x0) goto LAB_0010b2e0;
    fmt = "No memory for ZIP decompression";
  }
  else {
LAB_0010b2e0:
    wVar4 = zip_deflate_init(a,zip);
    if (wVar4 != L'\0') {
      return wVar4;
    }
    in = (uint8_t *)__archive_read_ahead(a,1,&bytes_avail);
    uVar2 = zip->entry->zip_flags;
    if (((uVar2 & 8) == 0) && (zip->entry_bytes_remaining < bytes_avail)) {
      bytes_avail = zip->entry_bytes_remaining;
    }
    if (bytes_avail < 0) {
      fmt = "Truncated ZIP file body";
      error_number = 0x54;
      goto LAB_0010b505;
    }
    if ((zip->tctx_valid != '\0') || (puVar6 = in, zip->cctx_valid != '\0')) {
      puVar7 = (uchar *)zip->decrypted_bytes_remaining;
      if (puVar7 < (ulong)bytes_avail) {
        out = zip->decrypted_ptr + (long)puVar7;
        puVar6 = zip->decrypted_buffer + (zip->decrypted_buffer_size - (long)out);
        if ((ulong)bytes_avail <= zip->decrypted_buffer + (zip->decrypted_buffer_size - (long)out))
        {
          puVar6 = (uchar *)bytes_avail;
        }
        if ((((((uVar2 & 8) != 0) ||
              (puVar3 = (uchar *)zip->entry_bytes_remaining, (long)puVar3 < 1)) ||
             ((long)(puVar7 + (long)puVar6) <= (long)puVar3)) ||
            (puVar6 = puVar3 + -(long)puVar7, puVar7 <= puVar3)) && (puVar6 != (uchar *)0x0)) {
          if (zip->tctx_valid == '\0') {
            dsize = (size_t)puVar6;
            aes_ctr_update(&zip->cctx,in,(size_t)puVar6,out,&dsize);
          }
          else {
            trad_enc_decrypt_update(&zip->tctx,in,(size_t)puVar6,out,(size_t)puVar6);
          }
          puVar7 = puVar6 + zip->decrypted_bytes_remaining;
          zip->decrypted_bytes_remaining = (size_t)puVar7;
        }
      }
      puVar6 = zip->decrypted_ptr;
      bytes_avail = (ssize_t)puVar7;
    }
    (zip->stream).next_in = puVar6;
    (zip->stream).avail_in = (uInt)bytes_avail;
    (zip->stream).total_in = 0;
    (zip->stream).next_out = zip->uncompressed_buffer;
    (zip->stream).avail_out = (uInt)zip->uncompressed_buffer_size;
    (zip->stream).total_out = 0;
    uVar5 = inflate(&zip->stream,0);
    if (uVar5 != 0xfffffffc) {
      if (uVar5 != 0) {
        if (uVar5 != 1) {
          archive_set_error(&a->archive,-1,"ZIP decompression failed (%d)",(ulong)uVar5);
          return L'\xffffffe2';
        }
        zip->end_of_entry = '\x01';
      }
      data_len = (zip->stream).total_in;
      __archive_read_consume(a,data_len);
      zip->entry_bytes_remaining = zip->entry_bytes_remaining - data_len;
      zip->entry_compressed_bytes_read = zip->entry_compressed_bytes_read + data_len;
      zip->entry_uncompressed_bytes_read =
           zip->entry_uncompressed_bytes_read + (zip->stream).total_out;
      if ((zip->tctx_valid != '\0') || (zip->cctx_valid != '\0')) {
        psVar1 = &zip->decrypted_bytes_remaining;
        *psVar1 = *psVar1 - data_len;
        if (*psVar1 == 0) {
          zip->decrypted_ptr = zip->decrypted_buffer;
        }
        else {
          zip->decrypted_ptr = zip->decrypted_ptr + data_len;
        }
      }
      if (zip->hctx_valid != '\0') {
        __hmac_sha1_update(&zip->hctx,in,data_len);
      }
      if (((zip->end_of_entry != '\0') && (zip->hctx_valid != '\0')) &&
         (wVar4 = check_authentication_code(a,(void *)0x0), wVar4 != L'\0')) {
        return wVar4;
      }
      *size = (zip->stream).total_out;
      *buff = zip->uncompressed_buffer;
      return L'\0';
    }
    fmt = "Out of memory for ZIP decompression";
  }
  error_number = 0xc;
LAB_0010b505:
  archive_set_error(&a->archive,error_number,fmt);
  return L'\xffffffe2';
}

Assistant:

static int
zip_read_data_deflate(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip *zip;
	ssize_t bytes_avail, to_consume = 0;
	const void *compressed_buff, *sp;
	int r;

	(void)offset; /* UNUSED */

	zip = (struct zip *)(a->format->data);

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = 256 * 1024;
		zip->uncompressed_buffer
		    = malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for ZIP decompression");
			return (ARCHIVE_FATAL);
		}
	}

	r = zip_deflate_init(a, zip);
	if (r != ARCHIVE_OK)
		return (r);

	/*
	 * Note: '1' here is a performance optimization.
	 * Recall that the decompression layer returns a count of
	 * available bytes; asking for more than that forces the
	 * decompressor to combine reads by copying data.
	 */
	compressed_buff = sp = __archive_read_ahead(a, 1, &bytes_avail);
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    && bytes_avail > zip->entry_bytes_remaining) {
		bytes_avail = (ssize_t)zip->entry_bytes_remaining;
	}
	if (bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file body");
		return (ARCHIVE_FATAL);
	}

	if (zip->tctx_valid || zip->cctx_valid) {
		if (zip->decrypted_bytes_remaining < (size_t)bytes_avail) {
			size_t buff_remaining =
			    (zip->decrypted_buffer +
			    zip->decrypted_buffer_size)
			    - (zip->decrypted_ptr +
			    zip->decrypted_bytes_remaining);

			if (buff_remaining > (size_t)bytes_avail)
				buff_remaining = (size_t)bytes_avail;

			if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END) &&
			      zip->entry_bytes_remaining > 0) {
				if ((int64_t)(zip->decrypted_bytes_remaining
				    + buff_remaining)
				      > zip->entry_bytes_remaining) {
					if (zip->entry_bytes_remaining <
					    (int64_t)zip->decrypted_bytes_remaining)
						buff_remaining = 0;
					else
						buff_remaining =
						    (size_t)zip->entry_bytes_remaining
						    - zip->decrypted_bytes_remaining;
				}
			}
			if (buff_remaining > 0) {
				if (zip->tctx_valid) {
					trad_enc_decrypt_update(&zip->tctx,
					    compressed_buff, buff_remaining,
					    zip->decrypted_ptr
					      + zip->decrypted_bytes_remaining,
					    buff_remaining);
				} else {
					size_t dsize = buff_remaining;
					archive_decrypto_aes_ctr_update(
					    &zip->cctx,
					    compressed_buff, buff_remaining,
					    zip->decrypted_ptr
					      + zip->decrypted_bytes_remaining,
					    &dsize);
				}
				zip->decrypted_bytes_remaining +=
				    buff_remaining;
			}
		}
		bytes_avail = zip->decrypted_bytes_remaining;
		compressed_buff = (const char *)zip->decrypted_ptr;
	}

	/*
	 * A bug in zlib.h: stream.next_in should be marked 'const'
	 * but isn't (the library never alters data through the
	 * next_in pointer, only reads it).  The result: this ugly
	 * cast to remove 'const'.
	 */
	zip->stream.next_in = (Bytef *)(uintptr_t)(const void *)compressed_buff;
	zip->stream.avail_in = (uInt)bytes_avail;
	zip->stream.total_in = 0;
	zip->stream.next_out = zip->uncompressed_buffer;
	zip->stream.avail_out = (uInt)zip->uncompressed_buffer_size;
	zip->stream.total_out = 0;

	r = inflate(&zip->stream, 0);
	switch (r) {
	case Z_OK:
		break;
	case Z_STREAM_END:
		zip->end_of_entry = 1;
		break;
	case Z_MEM_ERROR:
		archive_set_error(&a->archive, ENOMEM,
		    "Out of memory for ZIP decompression");
		return (ARCHIVE_FATAL);
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "ZIP decompression failed (%d)", r);
		return (ARCHIVE_FATAL);
	}

	/* Consume as much as the compressor actually used. */
	to_consume = zip->stream.total_in;
	__archive_read_consume(a, to_consume);
	zip->entry_bytes_remaining -= to_consume;
	zip->entry_compressed_bytes_read += to_consume;
	zip->entry_uncompressed_bytes_read += zip->stream.total_out;

	if (zip->tctx_valid || zip->cctx_valid) {
		zip->decrypted_bytes_remaining -= to_consume;
		if (zip->decrypted_bytes_remaining == 0)
			zip->decrypted_ptr = zip->decrypted_buffer;
		else
			zip->decrypted_ptr += to_consume;
	}
	if (zip->hctx_valid)
		archive_hmac_sha1_update(&zip->hctx, sp, to_consume);

	if (zip->end_of_entry) {
		if (zip->hctx_valid) {
			r = check_authentication_code(a, NULL);
			if (r != ARCHIVE_OK) {
				return (r);
			}
		}
	}

	*size = zip->stream.total_out;
	*buff = zip->uncompressed_buffer;

	return (ARCHIVE_OK);
}